

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O2

void __thiscall vmbt_mt_ifc::put_state_buf(vmbt_mt_ifc *this,char *buf)

{
  CVmMT19937::put_state(this->mt,buf);
  return;
}

Assistant:

virtual void put_state_buf(const char *buf) { mt->put_state(buf); }